

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_point_2d * mg_point_2d_make(uint16_t srid,double x_longitude,double y_latitude)

{
  ushort in_DI;
  mg_allocator *in_XMM0_Qa;
  double in_XMM1_Qa;
  mg_point_2d *point;
  mg_point_2d *local_8;
  
  local_8 = mg_point_2d_alloc(in_XMM0_Qa);
  if (local_8 == (mg_point_2d *)0x0) {
    local_8 = (mg_point_2d *)0x0;
  }
  else {
    local_8->srid = (ulong)in_DI;
    local_8->x = (double)in_XMM0_Qa;
    local_8->y = in_XMM1_Qa;
  }
  return local_8;
}

Assistant:

mg_point_2d *mg_point_2d_make(uint16_t srid, double x_longitude,
                              double y_latitude) {
  mg_point_2d *point = mg_point_2d_alloc(&mg_system_allocator);
  if (!point) {
    return NULL;
  }
  point->srid = srid;
  point->x = x_longitude;
  point->y = y_latitude;
  return point;
}